

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterfaceTests.cpp
# Opt level: O2

void setupMultiArrayFeature(FeatureDescription *feature,string *name)

{
  ulong uVar1;
  FeatureType *pFVar2;
  ArrayFeatureType *pAVar3;
  undefined8 *puVar4;
  
  uVar1 = (feature->super_MessageLite)._internal_metadata_.ptr_;
  puVar4 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    puVar4 = (undefined8 *)*puVar4;
  }
  google::protobuf::internal::ArenaStringPtr::Set(&feature->name_,name,puVar4);
  pFVar2 = CoreML::Specification::FeatureDescription::_internal_mutable_type(feature);
  pAVar3 = CoreML::Specification::FeatureType::_internal_mutable_multiarraytype(pFVar2);
  pAVar3->datatype_ = 0x10020;
  pFVar2 = CoreML::Specification::FeatureDescription::_internal_mutable_type(feature);
  pAVar3 = CoreML::Specification::FeatureType::_internal_mutable_multiarraytype(pFVar2);
  CoreML::Specification::ArrayFeatureType::_internal_add_shape(pAVar3,1);
  return;
}

Assistant:

static void setupMultiArrayFeature(Specification::FeatureDescription *feature, const std::string& name) {
    feature->set_name(name);
    feature->mutable_type()->mutable_multiarraytype()->set_datatype(::CoreML::Specification::ArrayFeatureType_ArrayDataType_FLOAT32);
    feature->mutable_type()->mutable_multiarraytype()->add_shape(1);
}